

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_tags
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,error_code *ec)

{
  uchar type;
  bool bVar1;
  error_code *in_RSI;
  reference *in_RDI;
  uint64_t val;
  cbor_major_type major_type;
  char_result<unsigned_char> c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  char_result<unsigned_char> in_stack_ffffffffffffffae;
  error_code *in_stack_ffffffffffffffb0;
  error_code *in_stack_ffffffffffffffc0;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  reference local_30;
  _WordT *local_20;
  cbor_major_type local_13;
  char_result<unsigned_char> local_12;
  error_code *local_10;
  
  local_10 = in_RSI;
  local_12 = bytes_source::peek((bytes_source *)(in_RDI + 3));
  if (((ushort)local_12 & 0x100) == 0) {
    local_13 = get_major_type(local_12.value);
    while (local_13 == semantic_tag) {
      local_20 = (_WordT *)get_uint64_value(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      bVar1 = std::error_code::operator_cast_to_bool(local_10);
      if (bVar1) {
        return;
      }
      bVar1 = SUB81((ulong)local_20 >> 0x38,0);
      if (local_20 == (_WordT *)0x19) {
        std::bitset<3UL>::operator[]
                  ((bitset<3UL> *)
                   CONCAT26(in_stack_ffffffffffffffae,
                            CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
                   (size_t)in_RDI);
        std::bitset<3UL>::reference::operator=(in_RDI,bVar1);
        std::bitset<3UL>::reference::~reference(&local_30);
      }
      else if (local_20 == (_WordT *)0x100) {
        std::bitset<3UL>::operator[]
                  ((bitset<3UL> *)
                   CONCAT26(in_stack_ffffffffffffffae,
                            CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
                   (size_t)in_RDI);
        std::bitset<3UL>::reference::operator=(in_RDI,bVar1);
        std::bitset<3UL>::reference::~reference((reference *)&stack0xffffffffffffffc0);
      }
      else {
        std::bitset<3UL>::operator[]
                  ((bitset<3UL> *)
                   CONCAT26(in_stack_ffffffffffffffae,
                            CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
                   (size_t)in_RDI);
        std::bitset<3UL>::reference::operator=(in_RDI,bVar1);
        std::bitset<3UL>::reference::~reference((reference *)&stack0xffffffffffffffb0);
        in_RDI[1]._M_wp = local_20;
      }
      in_stack_ffffffffffffffae = bytes_source::peek((bytes_source *)(in_RDI + 3));
      local_12 = in_stack_ffffffffffffffae;
      if (((ushort)in_stack_ffffffffffffffae & 0x100) != 0) {
        std::error_code::operator=
                  (in_stack_ffffffffffffffb0,
                   CONCAT22(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac));
        *(undefined1 *)&in_RDI->_M_bpos = 0;
        return;
      }
      local_12.value = in_stack_ffffffffffffffae.value;
      type = local_12.value;
      local_13 = get_major_type(type);
    }
  }
  else {
    std::error_code::operator=
              (in_stack_ffffffffffffffb0,
               CONCAT22(in_stack_ffffffffffffffae,in_stack_ffffffffffffffac));
    *(undefined1 *)&in_RDI->_M_bpos = 0;
  }
  return;
}

Assistant:

void read_tags(std::error_code& ec)
    {
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);

        while (major_type == jsoncons::cbor::detail::cbor_major_type::semantic_tag)
        {
            uint64_t val = get_uint64_value(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            switch(val)
            {
                case 25: // stringref
                    other_tags_[stringref_tag] = true;
                    break;
                case 256: // stringref-namespace
                    other_tags_[stringref_namespace_tag] = true;
                    break;
                default:
                    other_tags_[item_tag] = true;
                    raw_tag_ = val;
                    break;
            }
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = cbor_errc::unexpected_eof;
                more_ = false;
                return;
            }
            major_type = get_major_type(c.value);
        }
    }